

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

int Gia_ManLevelNum(Gia_Man_t *p)

{
  Gia_Obj_t *pObj;
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  uint uVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  Gia_ManCleanLevels(p,p->nObjs);
  p->nLevels = 0;
  uVar5 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    lVar9 = 0;
    lVar10 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pObj = (Gia_Obj_t *)(&pGVar2->field_0x0 + lVar9);
      uVar8 = *(ulong *)pObj;
      uVar6 = (uint)uVar8;
      if ((((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) ||
         ((uVar6 & 0x1fffffff) != ((uint)(uVar8 >> 0x20) & 0x1fffffff))) {
        uVar8 = uVar8 & 0x1fffffff;
        if (uVar8 == 0x1fffffff || (int)uVar6 < 0) {
          bVar11 = (int)uVar8 == 0x1fffffff;
          if (-1 < (int)uVar6 || bVar11) {
            if ((int)uVar5 <= lVar10) goto LAB_0073de2d;
            pVVar4 = p->vLevels;
            Vec_IntFillExtra(pVVar4,(int)lVar10 + 1,(int)CONCAT71((int7)(uVar8 >> 8),bVar11));
            if (pVVar4->nSize <= lVar10) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            pVVar4->pArray[lVar10] = 0;
            iVar7 = extraout_EDX_02;
          }
          else {
            Gia_ObjSetCoLevel(p,pObj);
            iVar7 = extraout_EDX_01;
          }
        }
        else {
          Gia_ObjSetGateLevel(p,pObj);
          iVar7 = extraout_EDX_00;
        }
      }
      else {
        Gia_ObjSetBufLevel(p,pObj);
        iVar7 = extraout_EDX;
      }
      pGVar3 = p->pObjs;
      if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) {
LAB_0073de2d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar1 = p->nLevels;
      uVar6 = (int)((long)pGVar2 + (lVar9 - (long)pGVar3) >> 2) * -0x55555555;
      pVVar4 = p->vLevels;
      Vec_IntFillExtra(pVVar4,uVar6 + 1,iVar7);
      if (((int)uVar6 < 0) || (pVVar4->nSize <= (int)uVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = pVVar4->pArray[uVar6 & 0x7fffffff];
      if (pVVar4->pArray[uVar6 & 0x7fffffff] < iVar1) {
        iVar7 = iVar1;
      }
      p->nLevels = iVar7;
      lVar10 = lVar10 + 1;
      uVar5 = (ulong)p->nObjs;
      lVar9 = lVar9 + 0xc;
    } while (lVar10 < (long)uVar5);
  }
  return p->nLevels;
}

Assistant:

int Gia_ManLevelNum( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    p->nLevels = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
            Gia_ObjSetBufLevel( p, pObj );
        else if ( Gia_ObjIsAnd(pObj) )
            Gia_ObjSetGateLevel( p, pObj );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjSetCoLevel( p, pObj );
        else
            Gia_ObjSetLevel( p, pObj, 0 );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    return p->nLevels;
}